

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::nextLogout(Session *this,Message *logout,UtcTimeStamp *timeStamp)

{
  bool bVar1;
  uint uVar2;
  uchar *in_R8;
  size_t in_R9;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  UtcTimeStamp *local_20;
  UtcTimeStamp *timeStamp_local;
  Message *logout_local;
  Session *this_local;
  
  local_20 = timeStamp;
  timeStamp_local = (UtcTimeStamp *)logout;
  logout_local = (Message *)this;
  uVar2 = verify(this,(EVP_PKEY_CTX *)logout,(uchar *)0x0,0,in_R8,in_R9);
  if ((uVar2 & 1) != 0) {
    bVar1 = SessionState::sentLogout(&this->m_state);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Received logout response",&local_c9);
      SessionState::onEvent(&this->m_state,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Received logout request",&local_41);
      SessionState::onEvent(&this->m_state,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
      generateLogout(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Sending logout response",&local_a1);
      SessionState::onEvent(&this->m_state,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    SessionState::incrNextTargetMsgSeqNum(&this->m_state);
    if ((this->m_resetOnLogout & 1U) != 0) {
      SessionState::reset(&this->m_state);
    }
    disconnect(this);
  }
  return;
}

Assistant:

void Session::nextLogout( const Message& logout, const UtcTimeStamp& timeStamp )
{
  if ( !verify( logout, false, false ) ) return ;
  if ( !m_state.sentLogout() )
  {
    m_state.onEvent( "Received logout request" );
    generateLogout();
    m_state.onEvent( "Sending logout response" );
  }
  else
    m_state.onEvent( "Received logout response" );

  m_state.incrNextTargetMsgSeqNum();
  if ( m_resetOnLogout ) m_state.reset();
  disconnect();
}